

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode_traits.hpp
# Opt level: O3

bool __thiscall
jsoncons::typed_array_visitor<std::vector<int,_std::allocator<int>_>_>::visit_double
          (typed_array_visitor<std::vector<int,_std::allocator<int>_>_> *this,double value,
          semantic_tag param_2,ser_context *param_3,error_code *param_4)

{
  vector<int,_std::allocator<int>_> *this_00;
  iterator __position;
  int local_4;
  
  this_00 = this->v_;
  __position._M_current =
       (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
       _M_finish;
  if (__position._M_current ==
      (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(this_00,__position,&local_4);
  }
  else {
    *__position._M_current = (int)value;
    (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
    _M_finish = __position._M_current + 1;
  }
  return true;
}

Assistant:

JSONCONS_VISITOR_RETURN_TYPE visit_double(double value, 
            semantic_tag,
            const ser_context&,
            std::error_code&) override
        {
            v_.push_back(static_cast<value_type>(value));
            JSONCONS_VISITOR_RETURN;
        }